

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_new_points.cpp
# Opt level: O3

void calc_line_two_points
               (Am_Object *inter,bool first_point,int x,int y,bool *abort,int *out_x1,int *out_y1,
               int *out_x2,int *out_y2)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  Am_Value *pAVar4;
  undefined7 in_register_00000031;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Am_Inter_Location last_points;
  int d;
  int c;
  int local_58;
  int local_54;
  bool *local_50;
  int *local_48;
  Am_Inter_Location local_40;
  int local_38;
  int local_34;
  
  local_48 = out_x1;
  pAVar4 = Am_Object::Get(inter,0xd9,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = Am_Object::Get(inter,0xe1,0);
  bVar2 = Am_Value::operator_cast_to_bool(pAVar4);
  piVar1 = local_48;
  *abort = false;
  if ((int)CONCAT71(in_register_00000031,first_point) == 0) {
    local_50 = abort;
    pAVar4 = Am_Object::Get(inter,0x16a,0);
    Am_Inter_Location::Am_Inter_Location(&local_40,pAVar4);
    Am_Inter_Location::Get_Points(&local_40,&local_54,&local_58,&local_34,&local_38);
    *piVar1 = local_54;
    *out_y1 = local_58;
    *out_x2 = x;
    *out_y2 = y;
    if (iVar3 != 0) {
      dVar6 = (double)(x - local_54);
      dVar5 = (double)(y - local_58);
      dVar7 = SQRT(dVar6 * dVar6 + dVar5 * dVar5);
      dVar8 = (double)iVar3;
      if (dVar7 < dVar8) {
        if (bVar2) {
          *local_50 = true;
        }
        if ((dVar7 != 0.0) || (NAN(dVar7))) {
          *out_x2 = (int)((dVar6 * dVar8) / dVar7 + (double)local_54);
          local_58 = (int)((dVar5 * dVar8) / dVar7 + (double)local_58);
        }
        else {
          *out_x2 = local_54 + iVar3;
        }
        *out_y2 = local_58;
      }
    }
    Am_Inter_Location::~Am_Inter_Location(&local_40);
  }
  else {
    *local_48 = x;
    *out_y1 = y;
    *out_x2 = x + iVar3;
    *out_y2 = y;
    if (bVar2 && iVar3 != 0) {
      *abort = true;
    }
  }
  return;
}

Assistant:

void
calc_line_two_points(Am_Object &inter, bool first_point, int x, int y,
                     bool &abort, int &out_x1, int &out_y1, int &out_x2,
                     int &out_y2)
{
  int min_length = inter.Get(Am_MINIMUM_LENGTH);
  bool want_abort = inter.Get(Am_ABORT_IF_TOO_SMALL);

  abort = false;

  if (first_point) {
    out_x1 = x;
    out_y1 = y;
    out_x2 = x + min_length; //by default, line is horizontal
    out_y2 = y;
    if (want_abort && min_length) {
      Am_INTER_TRACE_PRINT(inter, "-- line too small");
      abort = true;
    }
  } else { // second point
    Am_Inter_Location last_points = inter.Get(Am_INTERIM_VALUE);
    int first_x, first_y, c, d;
    last_points.Get_Points(first_x, first_y, c, d);
    out_x1 = first_x;
    out_y1 = first_y;
    out_x2 = x; // these may be overwritten below if required by min_length
    out_y2 = y;
    if (min_length) { // time for expensive math
      double x_dist = x - first_x;
      double y_dist = y - first_y;
      double denom = sqrt((x_dist * x_dist) + (y_dist * y_dist));
      if (denom < (double)min_length) {
        if (want_abort) {
          Am_INTER_TRACE_PRINT(inter, "-- line too small");
          abort = true;
        }
        if (denom == 0.0) { // don't divide by zero
          out_x2 = first_x + min_length;
          out_y2 = first_y;
        } else { // not zero, create a min_length line in correct direction
          out_x2 = (int)(first_x + ((x_dist * min_length) / denom));
          out_y2 = (int)(first_y + ((y_dist * min_length) / denom));
        }
      }
      // else using x,y as set above is fine
    }
  }
}